

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

bool libcellml::updateUnitMultiplier(UnitsPtr *units,int direction,double *multiplier)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  bool bVar2;
  int iVar3;
  element_type *peVar4;
  size_t sVar5;
  mapped_type *pmVar6;
  string *psVar7;
  double local_160;
  double branchMult;
  UnitsPtr refUnits;
  undefined1 local_138 [8];
  ModelPtr model;
  size_t sStack_120;
  bool ok;
  size_t i;
  double prefixMult;
  double standardMult;
  double expMult;
  double mult;
  double exp;
  string id;
  string pre;
  string ref;
  undefined1 local_60 [24];
  UnitsPtr importedUnits;
  ImportSourcePtr importSource;
  double localMultiplier;
  double *multiplier_local;
  int direction_local;
  UnitsPtr *units_local;
  
  importSource.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar4 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)units);
  bVar2 = ImportedEntity::isImport(&peVar4->super_ImportedEntity);
  if (bVar2) {
    peVar4 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)units);
    bVar2 = ImportedEntity::isResolved(&peVar4->super_ImportedEntity);
    if (!bVar2) {
      units_local._7_1_ = 0;
      goto LAB_00354282;
    }
    std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               units);
    p_Var1 = &importedUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
    ImportedEntity::importSource((ImportedEntity *)p_Var1);
    std::__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)p_Var1);
    ImportSource::model((ImportSource *)local_60);
    psVar7 = (string *)
             std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_60);
    peVar4 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)units);
    ImportedEntity::importReference_abi_cxx11_
              ((string *)((long)&ref.field_2 + 8),&peVar4->super_ImportedEntity);
    Model::units((Model *)(local_60 + 0x10),psVar7);
    std::__cxx11::string::~string((string *)(ref.field_2._M_local_buf + 8));
    std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_60);
    updateUnitMultiplier
              ((UnitsPtr *)(local_60 + 0x10),1,
               (double *)
               &importSource.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    *multiplier = (double)importSource.
                          super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi * (double)direction + *multiplier;
    std::shared_ptr<libcellml::Units>::~shared_ptr
              ((shared_ptr<libcellml::Units> *)(local_60 + 0x10));
    std::shared_ptr<libcellml::ImportSource>::~shared_ptr
              ((shared_ptr<libcellml::ImportSource> *)
               &importedUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  else {
    peVar4 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)units);
    sVar5 = Units::unitCount(peVar4);
    if (sVar5 != 0) {
      std::__cxx11::string::string((string *)(pre.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)(id.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)&exp);
      sStack_120 = 0;
      while( true ) {
        peVar4 = std::
                 __shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)units);
        sVar5 = Units::unitCount(peVar4);
        if (sVar5 <= sStack_120) break;
        peVar4 = std::
                 __shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)units);
        Units::unitAttributes
                  (peVar4,sStack_120,(string *)((long)&pre.field_2 + 8),
                   (string *)((long)&id.field_2 + 8),&mult,&standardMult,(string *)&exp);
        expMult = log10(standardMult);
        iVar3 = convertPrefixToInt((string *)((long)&id.field_2 + 8),
                                   (bool *)((long)&model.
                                                  super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi + 7));
        if ((model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi._7_1_ & 1) == 0) {
          units_local._7_1_ = 0;
          model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _0_4_ = 1;
          goto LAB_00354222;
        }
        bVar2 = isStandardUnitName((string *)((long)&pre.field_2 + 8));
        if (bVar2) {
          pmVar6 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                   ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                         *)standardMultiplierList_abi_cxx11_,(key_type *)((long)&pre.field_2 + 8));
          importSource.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               (*pmVar6 * mult + expMult + (double)iVar3 +
               importSource.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
        }
        else {
          p_Var1 = &refUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount;
          std::shared_ptr<libcellml::ParentedEntity_const>::shared_ptr<libcellml::Units,void>
                    ((shared_ptr<libcellml::ParentedEntity_const> *)p_Var1,units);
          owningModel((libcellml *)local_138,(ParentedEntityConstPtr *)p_Var1);
          std::shared_ptr<const_libcellml::ParentedEntity>::~shared_ptr
                    ((shared_ptr<const_libcellml::ParentedEntity> *)
                     &refUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          psVar7 = (string *)
                   std::
                   __shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_138);
          Model::units((Model *)&branchMult,psVar7);
          bVar2 = std::operator==((shared_ptr<libcellml::Units> *)&branchMult,(nullptr_t)0x0);
          if (bVar2) {
            units_local._7_1_ = 0;
            model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            ._0_4_ = 1;
          }
          else {
            local_160 = 0.0;
            bVar2 = updateUnitMultiplier((UnitsPtr *)&branchMult,1,&local_160);
            if (bVar2) {
              importSource.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   (local_160 * mult + expMult + (double)iVar3 +
                   importSource.
                   super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
              model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi._0_4_ = 0;
            }
            else {
              units_local._7_1_ = 0;
              model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi._0_4_ = 1;
            }
          }
          std::shared_ptr<libcellml::Units>::~shared_ptr
                    ((shared_ptr<libcellml::Units> *)&branchMult);
          std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_138);
          if ((int)model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi != 0) goto LAB_00354222;
        }
        sStack_120 = sStack_120 + 1;
      }
      *multiplier = (double)importSource.
                            super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi * (double)direction + *multiplier;
      model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
           = 0;
LAB_00354222:
      std::__cxx11::string::~string((string *)&exp);
      std::__cxx11::string::~string((string *)(id.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(pre.field_2._M_local_buf + 8));
      if ((int)model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi != 0) goto LAB_00354282;
    }
  }
  units_local._7_1_ = 1;
LAB_00354282:
  return (bool)(units_local._7_1_ & 1);
}

Assistant:

bool updateUnitMultiplier(const UnitsPtr &units, int direction, double &multiplier)
{
    double localMultiplier = 0;

    if (units->isImport()) {
        if (units->isResolved()) {
            auto importSource = units->importSource();
            auto importedUnits = importSource->model()->units(units->importReference());
            updateUnitMultiplier(importedUnits, 1, localMultiplier);
            multiplier += localMultiplier * direction;
        } else {
            return false;
        }
    } else if (units->unitCount() > 0) {
        std::string ref;
        std::string pre;
        std::string id;
        double exp;
        double mult;
        double expMult;
        double standardMult = 0.0;
        double prefixMult = 0.0;
        for (size_t i = 0; i < units->unitCount(); ++i) {
            units->unitAttributes(i, ref, pre, exp, expMult, id);
            mult = std::log10(expMult);

            bool ok;
            prefixMult = convertPrefixToInt(pre, &ok);
            if (!ok) {
                return false;
            }

            if (isStandardUnitName(ref)) {
                standardMult = standardMultiplierList.at(ref);
                // Combine the information into a single local multiplier: exponent only applies to standard multiplier.
                localMultiplier += mult + standardMult * exp + prefixMult;
            } else {
                auto model = owningModel(units);
                auto refUnits = model->units(ref);
                if (refUnits == nullptr) {
                    return false;
                }
                double branchMult = 0.0;
                // Return false when we can't find a valid prefix.
                if (!updateUnitMultiplier(refUnits, 1, branchMult)) {
                    return false;
                }
                // Make the direction positive on all branches, direction is only applied at the end.
                localMultiplier += mult + branchMult * exp + prefixMult;
            }
        }
        multiplier += localMultiplier * direction;
    }

    return true;
}